

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# res0.c
# Opt level: O2

int res0_inverse(vorbis_block *vb,vorbis_look_residue *vl,float **in,int *nonzero,int ch)

{
  int ch_00;
  ulong uVar1;
  ulong uVar2;
  long lVar3;
  
  uVar2 = 0;
  uVar1 = (ulong)(uint)ch;
  if (ch < 1) {
    uVar1 = uVar2;
  }
  ch_00 = 0;
  for (; uVar1 != uVar2; uVar2 = uVar2 + 1) {
    if (nonzero[uVar2] != 0) {
      lVar3 = (long)ch_00;
      ch_00 = ch_00 + 1;
      in[lVar3] = in[uVar2];
    }
  }
  if (ch_00 != 0) {
    _01inverse(vb,vl,in,ch_00,vorbis_book_decodevs_add);
  }
  return 0;
}

Assistant:

int res0_inverse(vorbis_block *vb,vorbis_look_residue *vl,
                 float **in,int *nonzero,int ch){
  int i,used=0;
  for(i=0;i<ch;i++)
    if(nonzero[i])
      in[used++]=in[i];
  if(used)
    return(_01inverse(vb,vl,in,used,vorbis_book_decodevs_add));
  else
    return(0);
}